

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

int __thiscall RenX::Server::sendWarnMessage(Server *this,PlayerInfo *player,string_view message)

{
  int iVar1;
  char *pcVar2;
  string_view str;
  string local_108;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  __sv_type local_38;
  PlayerInfo *local_28;
  PlayerInfo *player_local;
  Server *this_local;
  string_view message_local;
  
  pcVar2 = message._M_str;
  this_local = (Server *)message._M_len;
  local_28 = player;
  player_local = (PlayerInfo *)this;
  message_local._M_len = (size_t)pcVar2;
  s_abi_cxx11_(&local_b8,"cwarn pid",9);
  string_printf_abi_cxx11_(&local_d8,"%d ",(ulong)(uint)local_28->id);
  std::operator+(&local_98,&local_b8,&local_d8);
  str._M_str = pcVar2;
  str._M_len = message_local._M_len;
  escapifyRCON_abi_cxx11_(&local_108,(RenX *)this_local,str);
  std::operator+(&local_78,&local_98,&local_108);
  std::operator+(&local_58,&local_78,'\n');
  local_38 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_58);
  iVar1 = sendSocket(this,local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  return iVar1;
}

Assistant:

int RenX::Server::sendWarnMessage(const RenX::PlayerInfo &player, std::string_view message) {
	return sendSocket("cwarn pid"s + string_printf("%d ", player.id) + RenX::escapifyRCON(message) + '\n');
}